

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O2

string * __thiscall
vkt::BindingModel::(anonymous_namespace)::ImageDescriptorCase::genResourceDeclarations_abi_cxx11_
          (string *__return_storage_ptr__,void *this,VkShaderStageFlagBits stage,int numUsedBindings
          )

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  string *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  string dimension;
  string dimensionBase;
  string dimensionArray;
  int local_1cc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  string local_148;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  int local_88;
  int local_84;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  uVar1 = *(uint *)((long)this + 0x8c);
  if ((ulong)uVar1 < 6) {
    pcVar3 = &DAT_0096095c + *(int *)(&DAT_0096095c + (ulong)uVar1 * 4);
  }
  else {
    pcVar3 = (char *)0x0;
    if (uVar1 == 6) {
      pcVar3 = "Cube";
    }
  }
  local_1cc = numUsedBindings;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,pcVar3,(allocator<char> *)&local_40);
  uVar1 = *(uint *)((long)this + 0x8c);
  if ((ulong)uVar1 < 6) {
    pcVar3 = &DAT_00960974 + *(int *)(&DAT_00960974 + (ulong)uVar1 * 4);
  }
  else {
    pcVar3 = (char *)0x0;
    if (uVar1 == 6) {
      pcVar3 = "CubeArray";
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,pcVar3,(allocator<char> *)&local_a8);
  pbVar5 = &local_60;
  if ((*(uint *)((long)this + 0x8c) & 0xfffffffe) == 4) {
    pbVar5 = &local_40;
  }
  if (*(uint *)((long)this + 0x8c) == 6) {
    pbVar5 = &local_40;
  }
  std::__cxx11::string::string((string *)&local_a8,(string *)pbVar5);
  iVar2 = *(int *)((long)this + 0x88);
  if (iVar2 - 1U < 2) {
    switch(*(undefined4 *)((long)this + 0x84)) {
    case 0:
      if (iVar2 == 1) {
        de::toString<int>(&local_e8,&local_1cc);
        std::operator+(&local_148,"layout(set = 0, binding = ",&local_e8);
        std::operator+(&local_128,&local_148,") uniform highp texture");
        std::operator+(&local_108,&local_128,&local_a8);
        std::operator+(&local_1a8,&local_108," u_separateTexture;\nlayout(set = 0, binding = ");
        local_84 = local_1cc + 1;
        de::toString<int>(&local_c8,&local_84);
        std::operator+(&local_188,&local_1a8,&local_c8);
        std::operator+(&local_168,&local_188,
                       ") uniform highp sampler u_separateSamplerA;\nlayout(set = 0, binding = ");
        local_88 = local_1cc + 2;
        de::toString<int>(&local_80,&local_88);
        std::operator+(&local_1c8,&local_168,&local_80);
        std::operator+(__return_storage_ptr__,&local_1c8,
                       ") uniform highp sampler u_separateSamplerB;\n");
        std::__cxx11::string::~string((string *)&local_1c8);
        psVar4 = &local_80;
        goto LAB_0053cae6;
      }
      de::toString<int>(&local_e8,&local_1cc);
      std::operator+(&local_148,"layout(set = 0, binding = ",&local_e8);
      std::operator+(&local_128,&local_148,
                     ") uniform highp sampler u_separateSamplerA;\nlayout(set = 0, binding = ");
      local_84 = local_1cc + 1;
      de::toString<int>(&local_c8,&local_84);
      std::operator+(&local_108,&local_128,&local_c8);
      std::operator+(&local_1a8,&local_108,") uniform highp texture");
      std::operator+(&local_188,&local_1a8,&local_a8);
      std::operator+(&local_168,&local_188," u_separateTexture;\nlayout(set = 0, binding = ");
      local_88 = local_1cc + 2;
      de::toString<int>(&local_80,&local_88);
      std::operator+(&local_1c8,&local_168,&local_80);
      std::operator+(__return_storage_ptr__,&local_1c8,
                     ") uniform highp sampler u_separateSamplerB;\n");
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_108);
      pbVar5 = &local_c8;
      goto LAB_0053cb1e;
    case 1:
      de::toString<int>(&local_e8,&local_1cc);
      std::operator+(&local_148,"layout(set = 0, binding = ",&local_e8);
      std::operator+(&local_128,&local_148,") uniform highp sampler");
      std::operator+(&local_108,&local_128,&local_a8);
      std::operator+(&local_1a8,&local_108," u_combinedTextureSamplerA;\nlayout(set = 0, binding = "
                    );
      local_80._M_dataplus._M_p._0_4_ = local_1cc + 1;
      de::toString<int>(&local_c8,(int *)&local_80);
      std::operator+(&local_188,&local_1a8,&local_c8);
      std::operator+(&local_168,&local_188,") uniform highp sampler");
      std::operator+(&local_1c8,&local_168,&local_a8);
      std::operator+(__return_storage_ptr__,&local_1c8," u_combinedTextureSamplerB;\n");
      break;
    case 2:
      de::toString<int>(&local_e8,&local_1cc);
      std::operator+(&local_148,"layout(set = 0, binding = ",&local_e8);
      std::operator+(&local_128,&local_148,") uniform highp texture");
      std::operator+(&local_108,&local_128,&local_60);
      std::operator+(&local_1a8,&local_108," u_separateTextureA;\nlayout(set = 0, binding = ");
      local_80._M_dataplus._M_p._0_4_ = local_1cc + 1;
      de::toString<int>(&local_c8,(int *)&local_80);
      std::operator+(&local_188,&local_1a8,&local_c8);
      std::operator+(&local_168,&local_188,") uniform highp texture");
      std::operator+(&local_1c8,&local_168,&local_60);
      std::operator+(__return_storage_ptr__,&local_1c8," u_separateTextureB;\n");
      break;
    case 3:
      de::toString<int>(&local_e8,&local_1cc);
      std::operator+(&local_148,"layout(set = 0, binding = ",&local_e8);
      std::operator+(&local_128,&local_148,", rgba8) readonly uniform highp image");
      std::operator+(&local_108,&local_128,&local_a8);
      std::operator+(&local_1a8,&local_108," u_imageA;\nlayout(set = 0, binding = ");
      local_80._M_dataplus._M_p._0_4_ = local_1cc + 1;
      de::toString<int>(&local_c8,(int *)&local_80);
      std::operator+(&local_188,&local_1a8,&local_c8);
      std::operator+(&local_168,&local_188,", rgba8) readonly uniform highp image");
      std::operator+(&local_1c8,&local_168,&local_a8);
      std::operator+(__return_storage_ptr__,&local_1c8," u_imageB;\n");
      break;
    default:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_1c8);
      goto LAB_0053ce05;
    }
    psVar4 = &local_1c8;
LAB_0053cae6:
    std::__cxx11::string::~string((string *)psVar4);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_1a8);
    pbVar5 = &local_108;
LAB_0053cb1e:
    std::__cxx11::string::~string((string *)pbVar5);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_148);
    psVar4 = &local_e8;
  }
  else {
    if (iVar2 != 0) {
      if (iVar2 != 3) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_1c8);
        goto LAB_0053ce05;
      }
      switch(*(undefined4 *)((long)this + 0x84)) {
      case 0:
        de::toString<int>(&local_128,&local_1cc);
        std::operator+(&local_108,"layout(set = 0, binding = ",&local_128);
        std::operator+(&local_1a8,&local_108,") uniform highp texture");
        std::operator+(&local_188,&local_1a8,&local_a8);
        std::operator+(&local_168,&local_188," u_separateTexture;\nlayout(set = 0, binding = ");
        local_e8._M_dataplus._M_p._0_4_ = local_1cc + 1;
        de::toString<int>(&local_148,(int *)&local_e8);
        std::operator+(&local_1c8,&local_168,&local_148);
        std::operator+(__return_storage_ptr__,&local_1c8,
                       ") uniform highp sampler u_separateSampler[2];\n");
        goto LAB_0053c790;
      case 1:
        de::toString<int>(&local_1a8,&local_1cc);
        std::operator+(&local_188,"layout(set = 0, binding = ",&local_1a8);
        std::operator+(&local_168,&local_188,") uniform highp sampler");
        std::operator+(&local_1c8,&local_168,&local_a8);
        std::operator+(__return_storage_ptr__,&local_1c8," u_combinedTextureSampler[2];\n");
        break;
      case 2:
        de::toString<int>(&local_1a8,&local_1cc);
        std::operator+(&local_188,"layout(set = 0, binding = ",&local_1a8);
        std::operator+(&local_168,&local_188,") uniform highp texture");
        std::operator+(&local_1c8,&local_168,&local_60);
        std::operator+(__return_storage_ptr__,&local_1c8," u_separateTexture[2];\n");
        break;
      case 3:
        de::toString<int>(&local_1a8,&local_1cc);
        std::operator+(&local_188,"layout(set = 0, binding = ",&local_1a8);
        std::operator+(&local_168,&local_188,", rgba8) readonly uniform highp image");
        std::operator+(&local_1c8,&local_168,&local_a8);
        std::operator+(__return_storage_ptr__,&local_1c8," u_image[2];\n");
        break;
      default:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_1c8);
        goto LAB_0053ce05;
      }
      goto LAB_0053cddd;
    }
    switch(*(undefined4 *)((long)this + 0x84)) {
    case 0:
      de::toString<int>(&local_128,&local_1cc);
      std::operator+(&local_108,"layout(set = 0, binding = ",&local_128);
      std::operator+(&local_1a8,&local_108,") uniform highp texture");
      std::operator+(&local_188,&local_1a8,&local_a8);
      std::operator+(&local_168,&local_188," u_separateTexture;\nlayout(set = 0, binding = ");
      local_e8._M_dataplus._M_p._0_4_ = local_1cc + 1;
      de::toString<int>(&local_148,(int *)&local_e8);
      std::operator+(&local_1c8,&local_168,&local_148);
      std::operator+(__return_storage_ptr__,&local_1c8,
                     ") uniform highp sampler u_separateSampler;\n");
LAB_0053c790:
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_108);
      psVar4 = &local_128;
      goto LAB_0053ce00;
    case 1:
      de::toString<int>(&local_1a8,&local_1cc);
      std::operator+(&local_188,"layout(set = 0, binding = ",&local_1a8);
      std::operator+(&local_168,&local_188,") uniform highp sampler");
      std::operator+(&local_1c8,&local_168,&local_a8);
      std::operator+(__return_storage_ptr__,&local_1c8," u_combinedTextureSampler;\n");
      break;
    case 2:
      de::toString<int>(&local_1a8,&local_1cc);
      std::operator+(&local_188,"layout(set = 0, binding = ",&local_1a8);
      std::operator+(&local_168,&local_188,") uniform highp texture");
      std::operator+(&local_1c8,&local_168,&local_60);
      std::operator+(__return_storage_ptr__,&local_1c8," u_separateTexture;\n");
      break;
    case 3:
      de::toString<int>(&local_1a8,&local_1cc);
      std::operator+(&local_188,"layout(set = 0, binding = ",&local_1a8);
      std::operator+(&local_168,&local_188,", rgba8) readonly uniform highp image");
      std::operator+(&local_1c8,&local_168,&local_a8);
      std::operator+(__return_storage_ptr__,&local_1c8," u_image;\n");
      break;
    default:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_1c8);
      goto LAB_0053ce05;
    }
LAB_0053cddd:
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_188);
    psVar4 = &local_1a8;
  }
LAB_0053ce00:
  std::__cxx11::string::~string((string *)psVar4);
LAB_0053ce05:
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string ImageDescriptorCase::genResourceDeclarations (vk::VkShaderStageFlagBits stage, int numUsedBindings) const
{
	DE_UNREF(stage);

	// Vulkan-style resources are arrays implicitly, OpenGL-style are not
	const std::string	dimensionBase	= (m_viewType == vk::VK_IMAGE_VIEW_TYPE_1D || m_viewType == vk::VK_IMAGE_VIEW_TYPE_1D_ARRAY)		? ("1D")
										: (m_viewType == vk::VK_IMAGE_VIEW_TYPE_2D || m_viewType == vk::VK_IMAGE_VIEW_TYPE_2D_ARRAY)		? ("2D")
										: (m_viewType == vk::VK_IMAGE_VIEW_TYPE_3D)															? ("3D")
										: (m_viewType == vk::VK_IMAGE_VIEW_TYPE_CUBE || m_viewType == vk::VK_IMAGE_VIEW_TYPE_CUBE_ARRAY)	? ("Cube")
										: (DE_NULL);
	const std::string	dimensionArray	= (m_viewType == vk::VK_IMAGE_VIEW_TYPE_1D || m_viewType == vk::VK_IMAGE_VIEW_TYPE_1D_ARRAY)		? ("1DArray")
										: (m_viewType == vk::VK_IMAGE_VIEW_TYPE_2D || m_viewType == vk::VK_IMAGE_VIEW_TYPE_2D_ARRAY)		? ("2DArray")
										: (m_viewType == vk::VK_IMAGE_VIEW_TYPE_3D)															? ("3D")
										: (m_viewType == vk::VK_IMAGE_VIEW_TYPE_CUBE || m_viewType == vk::VK_IMAGE_VIEW_TYPE_CUBE_ARRAY)	? ("CubeArray")
										: (DE_NULL);
	const std::string	dimension		= isImageViewTypeArray(m_viewType) ? dimensionArray : dimensionBase;

	if (m_shaderInterface == SHADER_INPUT_MULTIPLE_DISCONTIGUOUS_DESCRIPTORS)
		DE_ASSERT(m_descriptorType == vk::VK_DESCRIPTOR_TYPE_SAMPLER);

	switch (m_shaderInterface)
	{
		case SHADER_INPUT_SINGLE_DESCRIPTOR:
		{
			switch (m_descriptorType)
			{
				case vk::VK_DESCRIPTOR_TYPE_SAMPLER:
					return "layout(set = 0, binding = " + de::toString(numUsedBindings) + ") uniform highp texture" + dimension + " u_separateTexture;\n"
						   "layout(set = 0, binding = " + de::toString(numUsedBindings+1) + ") uniform highp sampler u_separateSampler;\n";
				case vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER:
					return "layout(set = 0, binding = " + de::toString(numUsedBindings) + ") uniform highp sampler" + dimension + " u_combinedTextureSampler;\n";
				case vk::VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE:
					return "layout(set = 0, binding = " + de::toString(numUsedBindings) + ") uniform highp texture" + dimensionBase + " u_separateTexture;\n";
				case vk::VK_DESCRIPTOR_TYPE_STORAGE_IMAGE:
					return "layout(set = 0, binding = " + de::toString(numUsedBindings) + ", rgba8) readonly uniform highp image" + dimension + " u_image;\n";
				default:
					DE_FATAL("invalid descriptor");
					return "";
			}
		}

		case SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS:
		case SHADER_INPUT_MULTIPLE_DISCONTIGUOUS_DESCRIPTORS:
			switch (m_descriptorType)
			{
				case vk::VK_DESCRIPTOR_TYPE_SAMPLER:
					if (m_shaderInterface == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS)
						return "layout(set = 0, binding = " + de::toString(numUsedBindings) + ") uniform highp texture" + dimension + " u_separateTexture;\n"
								"layout(set = 0, binding = " + de::toString(numUsedBindings+1) + ") uniform highp sampler u_separateSamplerA;\n"
								"layout(set = 0, binding = " + de::toString(numUsedBindings+2) + ") uniform highp sampler u_separateSamplerB;\n";
					else
						return "layout(set = 0, binding = " + de::toString(numUsedBindings) + ") uniform highp sampler u_separateSamplerA;\n"
								"layout(set = 0, binding = " + de::toString(numUsedBindings+1) + ") uniform highp texture" + dimension + " u_separateTexture;\n"
								"layout(set = 0, binding = " + de::toString(numUsedBindings+2) + ") uniform highp sampler u_separateSamplerB;\n";
				case vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER:
					return "layout(set = 0, binding = " + de::toString(numUsedBindings) + ") uniform highp sampler" + dimension + " u_combinedTextureSamplerA;\n"
						   "layout(set = 0, binding = " + de::toString(numUsedBindings+1) + ") uniform highp sampler" + dimension + " u_combinedTextureSamplerB;\n";
				case vk::VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE:
					return "layout(set = 0, binding = " + de::toString(numUsedBindings) + ") uniform highp texture" + dimensionBase + " u_separateTextureA;\n"
						   "layout(set = 0, binding = " + de::toString(numUsedBindings+1) + ") uniform highp texture" + dimensionBase + " u_separateTextureB;\n";
				case vk::VK_DESCRIPTOR_TYPE_STORAGE_IMAGE:
					return "layout(set = 0, binding = " + de::toString(numUsedBindings) + ", rgba8) readonly uniform highp image" + dimension + " u_imageA;\n"
						   "layout(set = 0, binding = " + de::toString(numUsedBindings+1) + ", rgba8) readonly uniform highp image" + dimension + " u_imageB;\n";
				default:
					DE_FATAL("invalid descriptor");
					return "";
			}

		case SHADER_INPUT_DESCRIPTOR_ARRAY:
			switch (m_descriptorType)
			{
				case vk::VK_DESCRIPTOR_TYPE_SAMPLER:
					return "layout(set = 0, binding = " + de::toString(numUsedBindings) + ") uniform highp texture" + dimension + " u_separateTexture;\n"
						   "layout(set = 0, binding = " + de::toString(numUsedBindings+1) + ") uniform highp sampler u_separateSampler[2];\n";
				case vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER:
					return "layout(set = 0, binding = " + de::toString(numUsedBindings) + ") uniform highp sampler" + dimension + " u_combinedTextureSampler[2];\n";
				case vk::VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE:
					return "layout(set = 0, binding = " + de::toString(numUsedBindings) + ") uniform highp texture" + dimensionBase + " u_separateTexture[2];\n";
				case vk::VK_DESCRIPTOR_TYPE_STORAGE_IMAGE:
					return "layout(set = 0, binding = " + de::toString(numUsedBindings) + ", rgba8) readonly uniform highp image" + dimension + " u_image[2];\n";
				default:
					DE_FATAL("invalid descriptor");
					return "";
			}

		default:
			DE_FATAL("Impossible");
			return "";
	}
}